

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_cfile_stream.h
# Opt level: O0

ssize_t __thiscall
crnlib::cfile_stream::read(cfile_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  unsigned_long_long uVar3;
  size_t sVar4;
  undefined4 in_register_00000034;
  uint len_local;
  void *pBuf_local;
  cfile_stream *this_local;
  
  if (((((this->super_data_stream).field_0x1a & 1) == 0) ||
      (bVar1 = data_stream::is_readable(&this->super_data_stream), !bVar1)) || ((int)__buf == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    iVar2 = (*(this->super_data_stream)._vptr_data_stream[10])();
    uVar3 = math::minimum<unsigned_long_long>
                      ((ulong)__buf & 0xffffffff,CONCAT44(extraout_var,iVar2));
    this_local._4_4_ = (uint)uVar3;
    sVar4 = fread((void *)CONCAT44(in_register_00000034,__fd),1,uVar3 & 0xffffffff,
                  (FILE *)this->m_pFile);
    if (sVar4 == (uVar3 & 0xffffffff)) {
      this->m_ofs = (uVar3 & 0xffffffff) + this->m_ofs;
    }
    else {
      data_stream::set_error(&this->super_data_stream);
      this_local._4_4_ = 0;
    }
  }
  return (ulong)this_local._4_4_;
}

Assistant:

virtual uint read(void* pBuf, uint len)
        {
            CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

            if (!m_opened || (!is_readable()) || (!len))
            {
                return 0;
            }

            len = static_cast<uint>(math::minimum<uint64>(len, get_remaining()));

            if (fread(pBuf, 1, len, m_pFile) != len)
            {
                set_error();
                return 0;
            }

            m_ofs += len;
            return len;
        }